

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

Vector getNormalVector(Triangle *triangle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vector VVar12;
  
  uVar1 = (triangle->y).x;
  uVar3 = (triangle->y).y;
  fVar8 = (triangle->x).x;
  fVar6 = (triangle->x).y;
  fVar5 = (float)uVar1 - fVar8;
  fVar10 = (float)uVar3 - fVar6;
  fVar7 = (triangle->x).z;
  fVar9 = (triangle->y).z - fVar7;
  uVar2 = (triangle->z).x;
  uVar4 = (triangle->z).y;
  fVar8 = (float)uVar2 - fVar8;
  fVar6 = (float)uVar4 - fVar6;
  fVar7 = (triangle->z).z - fVar7;
  fVar11 = fVar10 * fVar7 - fVar9 * fVar6;
  fVar7 = fVar9 * fVar8 - fVar7 * fVar5;
  fVar6 = fVar6 * fVar5 - fVar8 * fVar10;
  fVar8 = fVar6 * fVar6 + fVar11 * fVar11 + fVar7 * fVar7;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  VVar12.z = fVar6 / fVar8;
  VVar12.y = fVar7 / fVar8;
  VVar12.x = fVar11 / fVar8;
  return VVar12;
}

Assistant:

Vector getNormalVector(Triangle const& triangle)
{
  Vector v0v1 = triangle.y - triangle.x;
  Vector v0v2 = triangle.z - triangle.x;
  return normalize(crossProduct(v0v1, v0v2));
}